

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O0

SimpleString __thiscall
CommandLineArguments::getParameterField
          (CommandLineArguments *this,int ac,char **av,int *i,SimpleString *parameterName)

{
  int iVar1;
  size_t sVar2;
  size_t extraout_RDX;
  SimpleString *in_R9;
  SimpleString SVar3;
  undefined1 local_50 [8];
  SimpleString parameter;
  size_t parameterLength;
  SimpleString *parameterName_local;
  int *i_local;
  char **av_local;
  int ac_local;
  CommandLineArguments *this_local;
  
  parameter.bufferSize_ = SimpleString::size(in_R9);
  SimpleString::SimpleString
            ((SimpleString *)local_50,*(char **)(i + (long)*(int *)&parameterName->buffer_ * 2));
  sVar2 = SimpleString::size((SimpleString *)local_50);
  if (parameter.bufferSize_ < sVar2) {
    SimpleString::SimpleString
              ((SimpleString *)this,
               (char *)(*(long *)(i + (long)*(int *)&parameterName->buffer_ * 2) +
                       parameter.bufferSize_));
  }
  else if (*(int *)&parameterName->buffer_ + 1 < (int)av) {
    iVar1 = *(int *)&parameterName->buffer_;
    *(int *)&parameterName->buffer_ = iVar1 + 1;
    SimpleString::SimpleString((SimpleString *)this,*(char **)(i + (long)iVar1 * 2 + 2));
  }
  else {
    SimpleString::SimpleString((SimpleString *)this,"");
  }
  SimpleString::~SimpleString((SimpleString *)local_50);
  SVar3.bufferSize_ = extraout_RDX;
  SVar3.buffer_ = (char *)this;
  return SVar3;
}

Assistant:

SimpleString CommandLineArguments::getParameterField(int ac, const char * const *av, int& i, const SimpleString& parameterName)
{
    size_t parameterLength = parameterName.size();
    SimpleString parameter(av[i]);
    if (parameter.size() >  parameterLength) return av[i] + parameterLength;
    else if (i + 1 < ac) return av[++i];
    return "";
}